

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O3

void __thiscall
CNetAddr::
UnserializeV2Stream<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
          (CNetAddr *this,
          ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s)

{
  uint uVar1;
  uint uVar2;
  uint8_t possible_bip155_net;
  bool bVar3;
  uint64_t address_size_00;
  CNetAddr *pCVar4;
  string *psVar5;
  size_t in_RCX;
  long lVar6;
  int __fd;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  size_t address_size;
  uint8_t obj;
  uint64_t local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::read(s->m_substream->m_substream,(int)&local_48,(void *)0x1,in_RCX);
  possible_bip155_net = (uint8_t)local_48._M_dataplus._M_p;
  address_size_00 =
       ReadCompactSize<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
                 (s,true);
  local_50 = address_size_00;
  if (0x200 < address_size_00) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_48,(tinyformat *)"Address too long: %u > %u",(char *)&local_50,
               &MAX_ADDRV2_SIZE,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(psVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_004cfff4;
  }
  this->m_scope_id = 0;
  bVar3 = SetNetFromBIP155Network(this,possible_bip155_net,address_size_00);
  if (!bVar3) {
    DataStream::ignore(s->m_substream->m_substream,address_size_00);
    goto LAB_004cfec6;
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,(size_type)address_size_00)
  ;
  uVar1 = (this->m_addr)._size;
  __fd = (int)*(undefined8 *)&(this->m_addr)._union;
  uVar2 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    __fd = (int)this;
    uVar2 = uVar1;
  }
  DataStream::read(s->m_substream->m_substream,__fd,(void *)(ulong)uVar2,in_RCX);
  if (this->m_net == NET_IPV6) {
    uVar1 = (this->m_addr)._size;
    uVar2 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar2 = uVar1;
    }
    if (5 < uVar2) {
      pCVar4 = this;
      if (0x10 < uVar1) {
        pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      lVar6 = 0;
      do {
        if (INTERNAL_IN_IPV6_PREFIX._M_elems[lVar6] != (pCVar4->m_addr)._union.direct[lVar6]) {
          if (uVar2 < 0xc) goto LAB_004cff24;
          lVar6 = 0;
          goto LAB_004cff0f;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      this->m_net = NET_INTERNAL;
      (pCVar4->m_addr)._union.indirect_contents.indirect =
           *(char **)((long)&(pCVar4->m_addr)._union.indirect_contents.indirect + 6);
      *(undefined2 *)((long)&(pCVar4->m_addr)._union + 8) =
           *(undefined2 *)((long)&(pCVar4->m_addr)._union + 0xe);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,10);
    }
  }
  goto LAB_004cfee2;
  while (lVar6 = lVar6 + 1, lVar6 != 0xc) {
LAB_004cff0f:
    if (IPV4_IN_IPV6_PREFIX._M_elems[lVar6] != (pCVar4->m_addr)._union.direct[lVar6])
    goto LAB_004cff24;
  }
  goto LAB_004cfec6;
LAB_004cff24:
  lVar6 = 0;
  do {
    if (TORV2_IN_IPV6_PREFIX._M_elems[lVar6] != (pCVar4->m_addr)._union.direct[lVar6])
    goto LAB_004cfee2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
LAB_004cfec6:
  this->m_net = NET_IPV6;
  local_48._M_dataplus._M_p._0_1_ = '\0';
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign(&this->m_addr,0x10,(uchar *)&local_48);
LAB_004cfee2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_004cfff4:
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }